

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Generator.h
# Opt level: O0

int __thiscall
cppqc::Generator<std::tuple<std::vector<int,_std::allocator<int>_>_>_>::
GenModel<cppqc::detail::TupleGenerator<std::vector<int,_std::allocator<int>_>_>_>::clone
          (GenModel<cppqc::detail::TupleGenerator<std::vector<int,_std::allocator<int>_>_>_> *this,
          __fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  void *pvVar1;
  TupleGenerator<std::vector<int,_std::allocator<int>_>_> *in_stack_ffffffffffffffc8;
  TupleGenerator<std::vector<int,_std::allocator<int>_>_> *in_stack_ffffffffffffffe8;
  GenModel<cppqc::detail::TupleGenerator<std::vector<int,_std::allocator<int>_>_>_>
  *in_stack_fffffffffffffff0;
  
  pvVar1 = operator_new(0x10);
  detail::TupleGenerator<std::vector<int,_std::allocator<int>_>_>::TupleGenerator
            ((TupleGenerator<std::vector<int,_std::allocator<int>_>_> *)this,
             in_stack_ffffffffffffffc8);
  GenModel(in_stack_fffffffffffffff0,in_stack_ffffffffffffffe8);
  detail::TupleGenerator<std::vector<int,_std::allocator<int>_>_>::~TupleGenerator
            ((TupleGenerator<std::vector<int,_std::allocator<int>_>_> *)0x12471c);
  return (int)pvVar1;
}

Assistant:

detail::GenConcept<T>* clone() const override {
      return new GenModel(m_obj);
    }